

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall
chrono::ChSystem::IntToDescriptor
          (ChSystem *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  element_type *peVar1;
  
  ChAssembly::IntToDescriptor(&this->assembly,off_v,v,R,off_L,L,Qc);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar1,(ulong)((off_v - (this->assembly).super_ChPhysicsItem.offset_w) +
                           (peVar1->super_ChPhysicsItem).offset_w),v,R,
             (ulong)((off_L - (this->assembly).super_ChPhysicsItem.offset_L) +
                    (peVar1->super_ChPhysicsItem).offset_L),L);
  return;
}

Assistant:

void ChSystem::IntToDescriptor(const unsigned int off_v,
                               const ChStateDelta& v,
                               const ChVectorDynamic<>& R,
                               const unsigned int off_L,
                               const ChVectorDynamic<>& L,
                               const ChVectorDynamic<>& Qc) {
    // Operate on assembly sub-objects (bodies, links, etc.)
    assembly.IntToDescriptor(off_v, v, R, off_L, L, Qc);

    // Use also on contact container:
    unsigned int displ_L = off_L - assembly.offset_L;
    unsigned int displ_v = off_v - assembly.offset_w;
    contact_container->IntToDescriptor(displ_v + contact_container->GetOffset_w(), v, R,
                                       displ_L + contact_container->GetOffset_L(), L, Qc);
}